

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     ConstantOperation<long,duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (QuantileState<long,_duckdb::QuantileStandardType> *state,long *input,
               AggregateUnaryInput *unary_input,idx_t count)

{
  QuantileState<long,_duckdb::QuantileStandardType> *in_RCX;
  idx_t i;
  QuantileState<long,_duckdb::QuantileStandardType> *input_00;
  
  for (input_00 = (QuantileState<long,_duckdb::QuantileStandardType> *)0x0; input_00 < in_RCX;
      input_00 = (QuantileState<long,_duckdb::QuantileStandardType> *)
                 ((long)&(input_00->v).super_vector<long,_std::allocator<long>_>.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    Operation<long,duckdb::QuantileState<long,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
              (in_RCX,(long *)input_00,(AggregateUnaryInput *)0xa1b4cf);
  }
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input,
	                              idx_t count) {
		for (idx_t i = 0; i < count; i++) {
			Operation<INPUT_TYPE, STATE, OP>(state, input, unary_input);
		}
	}